

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

bool __thiscall flatbuffers::rust::RustGenerator::GenerateIndividualFiles(RustGenerator *this)

{
  bool bVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  CodeWriter::Clear(&this->code_);
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(const_flatbuffers::EnumDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:408:32)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_flatbuffers::EnumDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:408:32)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  bVar1 = GenerateSymbols<flatbuffers::EnumDef>
                    (this,&((this->super_BaseGenerator).parser_)->enums_,
                     (function<void_(const_flatbuffers::EnumDef_&)> *)&local_28);
  if (bVar1) {
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(const_flatbuffers::StructDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:410:34)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_flatbuffers::StructDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:410:34)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    bVar1 = GenerateSymbols<flatbuffers::StructDef>
                      (this,&((this->super_BaseGenerator).parser_)->structs_,
                       (function<void_(const_flatbuffers::StructDef_&)> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  else {
    bVar1 = false;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return bVar1;
}

Assistant:

bool GenerateIndividualFiles() {
    code_.Clear();
    // Don't bother with imports. Use absolute paths everywhere.
    return GenerateSymbols<EnumDef>(
               parser_.enums_, [&](const EnumDef &e) { this->GenEnum(e); }) &&
           GenerateSymbols<StructDef>(
               parser_.structs_, [&](const StructDef &s) {
                 if (s.fixed) {
                   this->GenStruct(s);
                 } else {
                   this->GenTable(s);
                   if (this->parser_.opts.generate_object_based_api) {
                     this->GenTableObject(s);
                   }
                 }
                 if (this->parser_.root_struct_def_ == &s) {
                   this->GenRootTableFuncs(s);
                 }
               });
  }